

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Httpd.cpp
# Opt level: O1

int __thiscall xmrig::Httpd::auth(Httpd *this,HttpData *req)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t __n;
  int *piVar2;
  int iVar3;
  Config *pCVar4;
  const_iterator cVar5;
  mapped_type *pmVar6;
  int iVar7;
  bool bVar8;
  key_type local_48;
  
  pCVar4 = Base::config(this->m_base);
  paVar1 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"authorization","");
  cVar5 = std::
          _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(req->headers)._M_t,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if ((_Rb_tree_header *)cVar5._M_node == &(req->headers)._M_t._M_impl.super__Rb_tree_header) {
    iVar7 = 0x191;
    iVar3 = 200;
    if ((pCVar4->super_BaseConfig).m_http.m_token.m_data != (char *)0x0) {
      iVar3 = 0x191;
    }
    bVar8 = (pCVar4->super_BaseConfig).m_http.m_restricted == false;
  }
  else {
    if ((pCVar4->super_BaseConfig).m_http.m_token.m_data == (char *)0x0) {
      return 0x191;
    }
    local_48._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"authorization","");
    pmVar6 = std::
             map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::at(&req->headers,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    if (pmVar6->_M_string_length < 8) {
      return 0x193;
    }
    __n = (pCVar4->super_BaseConfig).m_http.m_token.m_size;
    if (__n != pmVar6->_M_string_length - 7) {
      return 0x193;
    }
    piVar2 = (int *)(pmVar6->_M_dataplus)._M_p;
    if (*(int *)((long)piVar2 + 3) != 0x20726572 || *piVar2 != 0x72616542) {
      return 0x193;
    }
    iVar3 = strncmp((pCVar4->super_BaseConfig).m_http.m_token.m_data,(char *)((long)piVar2 + 7),__n)
    ;
    bVar8 = iVar3 == 0;
    iVar7 = 200;
    iVar3 = 0x193;
  }
  if (bVar8) {
    iVar3 = iVar7;
  }
  return iVar3;
}

Assistant:

int xmrig::Httpd::auth(const HttpData &req) const
{
    const Http &config = m_base->config()->http();

    if (!req.headers.count(kAuthorization)) {
        return config.isAuthRequired() ? HTTP_STATUS_UNAUTHORIZED : HTTP_STATUS_OK;
    }

    if (config.token().isNull()) {
        return HTTP_STATUS_UNAUTHORIZED;
    }

    const std::string &token = req.headers.at(kAuthorization);
    const size_t size        = token.size();

    if (token.size() < 8 || config.token().size() != size - 7 || memcmp("Bearer ", token.c_str(), 7) != 0) {
        return HTTP_STATUS_FORBIDDEN;
    }

    return strncmp(config.token().data(), token.c_str() + 7, config.token().size()) == 0 ? HTTP_STATUS_OK : HTTP_STATUS_FORBIDDEN;
}